

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str * mctools_real_path(mcu8str *__return_storage_ptr__,mcu8str *rawpath)

{
  uint uVar1;
  char *pcVar2;
  char *__ptr;
  int iVar3;
  int iVar4;
  char *pcVar5;
  mcu8str native;
  mcu8str path;
  mcu8str output;
  char buf [4096];
  mcu8str local_1070;
  mcu8str local_1058;
  mcu8str local_1040;
  char local_1028 [4104];
  
  pcVar2 = rawpath->c_str;
  uVar1 = rawpath->size;
  local_1058.buflen = uVar1 + 1;
  local_1058.owns_memory = 0;
  local_1058.c_str = pcVar2;
  local_1058.size = uVar1;
  iVar4 = mctools_impl_has_winnamespace(rawpath);
  if (iVar4 != 0) {
    local_1058.c_str = pcVar2 + 4;
    local_1058.size = uVar1 - 4;
  }
  if (local_1058.size != 0) {
    local_1070.owns_memory = 0;
    local_1070.c_str = local_1028;
    local_1028[0] = '\0';
    local_1070.size = 0;
    local_1070.buflen = 0x1000;
    mcu8str_assign(&local_1070,&local_1058);
    mctools_pathseps_platform(&local_1070);
    mcu8str_create(&local_1040,0x1000);
    __ptr = local_1040.c_str;
    pcVar2 = local_1070.c_str;
    pcVar5 = realpath(local_1070.c_str,local_1040.c_str);
    iVar3 = local_1040.owns_memory;
    iVar4 = local_1070.owns_memory;
    if (pcVar5 != (char *)0x0) {
      local_1070.c_str = mcu8str_dealloc::dummy;
      local_1070.size = 0;
      local_1070.buflen = 0;
      local_1070.owns_memory = 0;
      if ((pcVar2 != (char *)0x0) && (iVar4 != 0)) {
        free(pcVar2);
      }
      mcu8str_update_size(&local_1040);
      mctools_pathseps_platform(&local_1040);
      *(ulong *)&__return_storage_ptr__->owns_memory =
           CONCAT44(local_1040._20_4_,local_1040.owns_memory);
      __return_storage_ptr__->c_str = local_1040.c_str;
      __return_storage_ptr__->size = local_1040.size;
      __return_storage_ptr__->buflen = local_1040.buflen;
      return __return_storage_ptr__;
    }
    local_1040.c_str = mcu8str_dealloc::dummy;
    local_1040.size = 0;
    local_1040.buflen = 0;
    local_1040.owns_memory = 0;
    if ((__ptr != (char *)0x0) && (iVar3 != 0)) {
      free(__ptr);
    }
    iVar4 = local_1070.owns_memory;
    local_1070.c_str = mcu8str_dealloc::dummy;
    local_1070.size = 0;
    local_1070.buflen = 0;
    local_1070.owns_memory = 0;
    if ((pcVar2 != (char *)0x0) && (iVar4 != 0)) {
      free(pcVar2);
    }
  }
  __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->buflen = 0;
  __return_storage_ptr__->owns_memory = 0;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_real_path( const mcu8str* rawpath )
  {
    //NB: Might return empty in case of errors.
    mcu8str path = mctools_impl_view_no_winnamespace(rawpath);
    if ( path.size == 0 )
      return mcu8str_create_empty();

#ifdef MC_IS_WINDOWS
    //To resolve symlinks we must open a file handle with CreateFileW. If it
    //fails, we revert back to at least returning an absolute path.
    mcwinstr wpath = mc_path2wpath( &path );
    DWORD share = FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE;
    DWORD access = FILE_READ_ATTRIBUTES;
    DWORD flags = FILE_FLAG_BACKUP_SEMANTICS;
    HANDLE fh1 = CreateFileW( wpath.c_str, access, share, NULL,
                              OPEN_EXISTING, flags, NULL );
    if ( fh1 == INVALID_HANDLE_VALUE ) {
      //Failed to open. This can happen for a variety of reasons. As a fallback
      //option, we return the full path (which won't resolve symlinks):
      mcu8str output = mc_winstr_expand_to_fullpath_u8str( &wpath );
      mc_winstr_dealloc( &wpath );
      return output;
    }

    //We have an open handle fh1, use it to find the resolved path:
    mcwinstr resolvedpath = mc_winstr_create(4096);
    DWORD len = GetFinalPathNameByHandleW( fh1, resolvedpath.c_str,
                                           (DWORD)resolvedpath.buflen, 0 );
    if ( (mcu8str_size_t)len >= resolvedpath.buflen ) {
      //Too short buffer, try again:
      mc_winstr_dealloc(&resolvedpath);
      resolvedpath = mc_winstr_create(len);
      len = GetFinalPathNameByHandleW( fh1, resolvedpath.c_str,
                                       (DWORD)resolvedpath.buflen, 0 );
    }
    //Close the open file handle:
    CloseHandle( fh1 );
    if ( len == 0 || (mcu8str_size_t)len >= resolvedpath.buflen ) {
      //Failure, fall-back to unresolved absolute path:
      mc_winstr_dealloc(&resolvedpath);
      mcu8str output = mc_winstr_expand_to_fullpath_u8str( &wpath );
      mc_winstr_dealloc( &wpath );
      return output;
    }
    mc_winstr_dealloc( &wpath );
    resolvedpath.c_str[len] = 0;
    resolvedpath.size = len;
    //All ok, get rid of any 8.3-form path names and return:
    mcwinstr woutput = mc_impl_expand_wpath_to_longpathname( &resolvedpath );
    mc_winstr_dealloc(&resolvedpath);
    mcu8str output = mc_winstr_to_u8str( &woutput );
    mc_winstr_dealloc( &woutput );
    if ( mctools_impl_has_winnamespace( &output ) ) {
      mcu8str tmp = mctools_impl_view_no_winnamespace( &output );
      mcu8str_ensure_dynamic_buffer(&tmp);
      mcu8str_swap( &tmp, &output );
      mcu8str_dealloc(&tmp);
    }
#else
    char buf[4096];
    mcu8str native = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    mcu8str_assign( &native, &path );
    mctools_pathseps_platform( &native );
    mcu8str output = mcu8str_create( PATH_MAX );
    if ( !realpath( native.c_str, output.c_str ) ) {
      //failure
      mcu8str_dealloc(&output);
      mcu8str_dealloc(&native);
      return mcu8str_create_empty();
    }
    mcu8str_dealloc(&native);
    mcu8str_update_size(&output);
#endif
    mctools_pathseps_platform(&output);
    return output;
  }